

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O0

size_t interp_compress(uint8_t *obuff,size_t osize,uint32_t *ibuff,size_t isize)

{
  uint uVar1;
  uint8_t *obuff_00;
  reference pvVar2;
  value_type vVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  size_t sVar4;
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  uint8_t *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> T;
  size_t op;
  uint64_t v;
  uint64_t vr;
  uint64_t vl;
  uint64_t vp;
  int p;
  int i;
  allocator_type *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  size_t local_50;
  uint64_t local_48;
  ulong local_40;
  ulong local_38;
  value_type local_30;
  int local_28;
  int local_24;
  ulong local_20;
  long local_18;
  long local_10;
  uint8_t *local_8;
  
  local_50 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x177481);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1774a1);
  for (local_24 = 0; (ulong)(long)local_24 < local_20; local_24 = local_24 + 1) {
    uVar1 = *(uint *)(local_18 + (long)local_24 * 4);
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_68,((long)local_24 + local_20) - 1);
    *pvVar2 = (ulong)uVar1;
  }
  for (local_28 = (int)local_20 + -2; obuff_00 = local_8, -1 < local_28; local_28 = local_28 + -1) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_68,(long)(local_28 * 2 + 1));
    vVar3 = *pvVar2;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_68,(long)(local_28 * 2 + 2));
    vVar3 = (vVar3 + *pvVar2) - 1;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_68,(long)local_28);
    *pvVar2 = vVar3;
  }
  this = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_10 - local_50);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_68,0);
  sVar4 = byte_encode(obuff_00,(size_t)this,*pvVar2,0x8000000000000000);
  local_50 = sVar4 + local_50;
  for (local_28 = 0; sVar4 = local_50, (ulong)(long)local_28 < local_20 - 1; local_28 = local_28 + 1
      ) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_68,(long)local_28);
    local_30 = *pvVar2;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_68,(long)(local_28 * 2 + 1));
    local_38 = *pvVar2;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_68,(long)(local_28 * 2 + 2));
    local_40 = *pvVar2;
    if (local_40 < local_38) {
      local_48 = local_38 - local_40;
    }
    else {
      local_48 = (local_40 - local_38) + 1;
    }
    sVar4 = byte_encode(local_8 + local_50,local_10 - local_50,local_48,local_30);
    local_50 = sVar4 + local_50;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this);
  return sVar4;
}

Assistant:

size_t interp_compress(uint8_t* obuff, /* output buffer */
    size_t osize, /* output buffer size */
    const uint32_t* ibuff, /* input buffer */
    size_t isize)
{ /* input buffer size */

    int i, p;
    uint64_t vp, vl, vr, v;
    size_t op = 0;

    std::vector<uint64_t> T(2 * isize - 1);

    for (i = 0; i < isize; i++) {
        T[i + isize - 1] = ibuff[i];
    }
    for (p = isize - 2; p >= 0; p--) {
        T[p] = T[2 * p + 1] + T[2 * p + 2] - 1;
    }
    op += byte_encode(obuff, osize - op, T[0], (1LL << 63));
    for (p = 0; p < isize - 1; p++) {
        vp = T[p];
        vl = T[2 * p + 1];
        vr = T[2 * p + 2];
        if (vl <= vr) {
            v = vr - vl + 1;
        } else {
            v = vl - vr;
        }
        op += byte_encode(obuff + op, osize - op, v, vp);
    }
    return op;
}